

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O3

void re2::SetUnanchored(void)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> v;
  Set s;
  vector<int,_std::allocator<int>_> local_1f8;
  LogMessage local_1e0;
  Set local_60;
  
  RE2::Options::Options((Options *)&local_1e0,DefaultOptions);
  RE2::Set::Set(&local_60,(Options *)&local_1e0,UNANCHORED);
  local_1e0._0_8_ = "foo";
  local_1e0._8_4_ = 3;
  iVar2 = RE2::Set::Add(&local_60,(StringPiece *)&local_1e0,(string *)0x0);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x12,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (s.Add(\"foo\", __null)) == (0)",
               0x2b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "(";
  local_1e0._8_4_ = 1;
  iVar2 = RE2::Set::Add(&local_60,(StringPiece *)&local_1e0,(string *)0x0);
  if (iVar2 != -1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x13,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (s.Add(\"(\", __null)) == (-1)",0x2a
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "bar";
  local_1e0._8_4_ = 3;
  iVar2 = RE2::Set::Add(&local_60,(StringPiece *)&local_1e0,(string *)0x0);
  if (iVar2 != 1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x14,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (s.Add(\"bar\", __null)) == (1)",
               0x2b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  bVar1 = RE2::Set::Compile(&local_60);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x15,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (s.Compile()) == (true)",0x25);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "foobar";
  local_1e0._8_4_ = 6;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,
                          (vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x17,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),
               "Check failed: (s.Match(\"foobar\", __null)) == (true)",0x33);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "fooba";
  local_1e0._8_4_ = 5;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,
                          (vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x18,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),
               "Check failed: (s.Match(\"fooba\", __null)) == (true)",0x32);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "oobar";
  local_1e0._8_4_ = 5;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,
                          (vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x19,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),
               "Check failed: (s.Match(\"oobar\", __null)) == (true)",0x32);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1e0._0_8_ = "foobar";
  local_1e0._8_4_ = 6;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,&local_1f8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (s.Match(\"foobar\", &v)) == (true)"
               ,0x2f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if ((long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 8) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v.size()) == (2)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if (*local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start != 0) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v[0]) == (0)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[1] != 1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v[1]) == (1)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "fooba";
  local_1e0._8_4_ = 5;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,&local_1f8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x21,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (s.Match(\"fooba\", &v)) == (true)",
               0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if ((long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x22,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v.size()) == (1)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if (*local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start != 0) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x23,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v[0]) == (0)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "oobar";
  local_1e0._8_4_ = 5;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,&local_1f8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x25,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (s.Match(\"oobar\", &v)) == (true)",
               0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if ((long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x26,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v.size()) == (1)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if (*local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start != 1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x27,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v[0]) == (1)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
    if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (int *)0x0) goto LAB_0011516b;
  }
  operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_0011516b:
  RE2::Set::~Set(&local_60);
  return;
}

Assistant:

TEST(Set, Unanchored) {
  RE2::Set s(RE2::DefaultOptions, RE2::UNANCHORED);

  CHECK_EQ(s.Add("foo", NULL), 0);
  CHECK_EQ(s.Add("(", NULL), -1);
  CHECK_EQ(s.Add("bar", NULL), 1);
  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("foobar", NULL), true);
  CHECK_EQ(s.Match("fooba", NULL), true);
  CHECK_EQ(s.Match("oobar", NULL), true);

  vector<int> v;
  CHECK_EQ(s.Match("foobar", &v), true);
  CHECK_EQ(v.size(), 2);
  CHECK_EQ(v[0], 0);
  CHECK_EQ(v[1], 1);

  CHECK_EQ(s.Match("fooba", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);

  CHECK_EQ(s.Match("oobar", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 1);
}